

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O3

void botpCtrNext(octet *ctr)

{
  byte bVar1;
  octet oVar2;
  octet oVar3;
  octet oVar4;
  octet oVar5;
  octet oVar6;
  octet oVar7;
  octet oVar8;
  
  bVar1 = ctr[7];
  oVar2 = bVar1 + 1;
  ctr[7] = oVar2;
  oVar5 = ctr[6] + (0xfe < bVar1);
  ctr[6] = oVar5;
  oVar3 = ctr[5] + (oVar5 == '\0' && oVar2 == '\0');
  ctr[5] = oVar3;
  oVar6 = ctr[4] + (oVar3 == '\0' && (oVar5 == '\0' && oVar2 == '\0'));
  ctr[4] = oVar6;
  oVar4 = ctr[3] + (oVar6 == '\0' && (oVar3 == '\0' && (oVar5 == '\0' && oVar2 == '\0')));
  ctr[3] = oVar4;
  oVar7 = ctr[2] + (oVar4 == '\0' &&
                   (oVar6 == '\0' && (oVar3 == '\0' && (oVar5 == '\0' && oVar2 == '\0'))));
  ctr[2] = oVar7;
  oVar8 = ctr[1] + (oVar7 == '\0' &&
                   (oVar4 == '\0' &&
                   (oVar6 == '\0' && (oVar3 == '\0' && (oVar5 == '\0' && oVar2 == '\0')))));
  ctr[1] = oVar8;
  *ctr = *ctr + (oVar8 == '\0' &&
                (oVar7 == '\0' &&
                (oVar4 == '\0' &&
                (oVar6 == '\0' && (oVar3 == '\0' && (oVar5 == '\0' && oVar2 == '\0'))))));
  return;
}

Assistant:

void botpCtrNext(octet ctr[8])
{
	register octet carry = 1;
	ASSERT(memIsValid(ctr, 8));
	carry = ((ctr[7] += carry) < carry);
	carry = ((ctr[6] += carry) < carry);
	carry = ((ctr[5] += carry) < carry);
	carry = ((ctr[4] += carry) < carry);
	carry = ((ctr[3] += carry) < carry);
	carry = ((ctr[2] += carry) < carry);
	carry = ((ctr[1] += carry) < carry);
	carry = ((ctr[0] += carry) < carry);
	carry = 0;
}